

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *pvVar4;
  unsigned_long *puVar5;
  pointer ppVar6;
  size_t sVar7;
  size_type __n;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  HelpOptionDetails *extraout_RDX;
  HelpOptionDetails *extraout_RDX_00;
  HelpOptionDetails *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_01;
  size_t in_R8;
  bool local_2c9;
  bool local_2a9;
  allocator<char> local_279;
  string local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  allocator<char> local_231;
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  String d;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1c8;
  reference local_1c0;
  HelpOptionDetails *o_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *__range1_1;
  iterator fiter;
  size_t allowed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  size_t local_128;
  undefined1 local_120 [8];
  String s;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f8;
  reference local_f0;
  HelpOptionDetails *o;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_69;
  unsigned_long local_68;
  size_t longest;
  OptionHelp format;
  allocator<char> local_31;
  _Self local_30;
  _Self local_28;
  const_iterator group;
  string *g_local;
  Options *this_local;
  String *result;
  
  group._M_node = (_Base_ptr)g;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
       ::find(&this->m_help,g);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
       ::end(&this->m_help);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&longest);
    local_68 = 0;
    local_69 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     " ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         group._M_node);
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     " options:\n");
      toLocalString<std::__cxx11::string>(&local_90,(cxxopts *)&local_b0,t);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&__range1);
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
             ::operator->(&local_28);
    pvVar4 = &(ppVar3->second).options;
    __end1 = std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::
             begin(pvVar4);
    o = (HelpOptionDetails *)
        std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::end
                  (pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                                       *)&o), bVar1) {
      local_f0 = __gnu_cxx::
                 __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                 ::operator*(&__end1);
      local_2a9 = false;
      o_00 = extraout_RDX;
      if ((local_f0->is_container & 1U) != 0) {
        local_f8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->m_positional_set,&local_f0->l);
        s.field_2._8_8_ =
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->m_positional_set);
        local_2a9 = std::__detail::operator!=
                              (&local_f8,
                               (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)((long)&s.field_2 + 8));
        o_00 = extraout_RDX_00;
      }
      if (local_2a9 == false) {
        (anonymous_namespace)::format_option_abi_cxx11_
                  ((String *)local_120,(_anonymous_namespace_ *)local_f0,o_00);
        local_128 = stringLength((String *)local_120);
        puVar5 = std::max<unsigned_long>(&local_68,&local_128);
        local_68 = *puVar5;
        std::__cxx11::string::string((string *)&local_188);
        std::make_pair<std::__cxx11::string&,std::__cxx11::string>
                  (&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_188);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&longest,&local_168);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)local_120);
      }
      __gnu_cxx::
      __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
      ::operator++(&__end1);
    }
    allowed = 0x1e;
    puVar5 = std::min<unsigned_long>(&local_68,&allowed);
    local_68 = *puVar5;
    fiter._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(0x4a - local_68);
    __range1_1 = (vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *)
                 std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&longest);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
             ::operator->(&local_28);
    pvVar4 = &(ppVar3->second).options;
    __end1_1 = std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
               ::begin(pvVar4);
    o_1 = (HelpOptionDetails *)
          std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::end
                    (pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)&o_1), bVar1) {
      local_1c0 = __gnu_cxx::
                  __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                  ::operator*(&__end1_1);
      local_2c9 = false;
      if ((local_1c0->is_container & 1U) != 0) {
        local_1c8._M_cur =
             (__node_type *)
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->m_positional_set,&local_1c0->l);
        d.field_2._8_8_ =
             std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->m_positional_set);
        local_2c9 = std::__detail::operator!=
                              (&local_1c8,
                               (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)((long)&d.field_2 + 8));
      }
      if (local_2c9 == false) {
        (anonymous_namespace)::format_description_abi_cxx11_
                  ((String *)local_1f0,(_anonymous_namespace_ *)local_1c0,
                   (HelpOptionDetails *)(local_68 + 2),(size_t)fiter._M_current,in_R8);
        ppVar6 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&__range1_1);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)ppVar6);
        ppVar6 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&__range1_1);
        sVar7 = stringLength(&ppVar6->first);
        if (local_68 < sVar7) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
          __n = local_68 + 2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_230,__n,' ',&local_231);
          toLocalString<std::__cxx11::string>(&local_210,(cxxopts *)local_230,t_00);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string(local_230);
          std::allocator<char>::~allocator(&local_231);
        }
        else {
          lVar8 = local_68 + 2;
          ppVar6 = __gnu_cxx::
                   __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&__range1_1);
          sVar7 = stringLength(&ppVar6->first);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_278,lVar8 - sVar7,' ',&local_279)
          ;
          toLocalString<std::__cxx11::string>(&local_258,(cxxopts *)local_278,t_01);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string(local_278);
          std::allocator<char>::~allocator(&local_279);
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_1f0);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&__range1_1);
        std::__cxx11::string::~string((string *)local_1f0);
      }
      __gnu_cxx::
      __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
      ::operator++(&__end1_1);
    }
    local_69 = 1;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&longest);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}